

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

int writewbmp(Wbmp *wbmp,_func_void_int_void_ptr *putout,void *out)

{
  uint local_30;
  int local_2c;
  int octet;
  int bitpos;
  int col;
  int row;
  void *out_local;
  _func_void_int_void_ptr *putout_local;
  Wbmp *wbmp_local;
  
  (*putout)(0,out);
  (*putout)(0,out);
  putmbi(wbmp->width,putout,out);
  putmbi(wbmp->height,putout,out);
  for (bitpos = 0; bitpos < wbmp->height; bitpos = bitpos + 1) {
    local_2c = 8;
    local_30 = 0;
    for (octet = 0; octet < wbmp->width; octet = octet + 1) {
      local_2c = local_2c + -1;
      local_30 = (uint)(wbmp->bitmap[bitpos * wbmp->width + octet] == 1) << ((byte)local_2c & 0x1f)
                 | local_30;
      if (local_2c == 0) {
        local_2c = 8;
        (*putout)(local_30,out);
        local_30 = 0;
      }
    }
    if (local_2c != 8) {
      (*putout)(local_30,out);
    }
  }
  return 0;
}

Assistant:

int writewbmp(Wbmp *wbmp, void (*putout)(int c, void *out), void *out)
{
	int row, col;
	int bitpos, octet;

	/* Generate the header */
	putout(0, out); /* WBMP Type 0: B/W, Uncompressed bitmap */
	putout(0, out); /* FixHeaderField */

	/* Size of the image */
	putmbi(wbmp->width, putout, out);	/* width */
	putmbi(wbmp->height, putout, out);	/* height */


	/* Image data */
	for(row = 0; row < wbmp->height; row++) {
		bitpos = 8;
		octet = 0;

		for(col = 0; col < wbmp->width; col++) {
			octet |= ((wbmp->bitmap[row * wbmp->width + col] == 1) ? WBMP_WHITE : WBMP_BLACK) << --bitpos;
			if(bitpos == 0) {
				bitpos = 8;
				putout(octet, out);
				octet = 0;
			}
		}

		if(bitpos != 8) {
			putout(octet, out);
		}
	}

	return 0;
}